

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypes.h
# Opt level: O2

DateTime * FIX::DateTime::fromTm(DateTime *__return_storage_ptr__,tm *tm,int fraction,int precision)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = convertToNanos(fraction,precision);
  iVar5 = julianDate(tm->tm_year + 0x76c,tm->tm_mon + 1,tm->tm_mday);
  iVar1 = tm->tm_hour;
  iVar2 = tm->tm_min;
  iVar3 = tm->tm_sec;
  __return_storage_ptr__->_vptr_DateTime = (_func_int **)&PTR__DateTime_00322540;
  __return_storage_ptr__->m_date = iVar5;
  __return_storage_ptr__->m_time =
       (long)iVar4 + ((long)iVar2 * 0x3c + (long)iVar1 * 0xe10 + (long)iVar3) * 1000000000;
  return __return_storage_ptr__;
}

Assistant:

static DateTime fromTm( const tm& tm, int fraction, int precision )
  {
    int nanos = convertToNanos(fraction, precision);
    return DateTime ( julianDate(tm.tm_year + 1900, tm.tm_mon + 1,
                                 tm.tm_mday),
                     makeHMS(tm.tm_hour, tm.tm_min, tm.tm_sec, nanos) );
  }